

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_7z.c
# Opt level: O2

void SZIP_global_init(void)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  UInt32 *pUVar9;
  ulong uVar10;
  int iVar11;
  uint i;
  long lVar12;
  bool bVar13;
  
  if (SZIP_global_init_generatedTable == '\0') {
    SZIP_global_init_generatedTable = '\x01';
    for (uVar6 = 0; uVar6 != 0x100; uVar6 = uVar6 + 1) {
      iVar11 = 8;
      uVar10 = uVar6 & 0xffffffff;
      while( true ) {
        bVar13 = iVar11 == 0;
        iVar11 = iVar11 + -1;
        if (bVar13) break;
        uVar10 = (ulong)(-((uint)uVar10 & 1) & 0xedb88320 ^ (uint)(uVar10 >> 1));
      }
      g_CrcTable[uVar6] = (uint)uVar10;
    }
    for (lVar7 = 0x100; lVar7 != 0x800; lVar7 = lVar7 + 1) {
      uVar1 = *(uint *)((long)&_DYNAMIC[0x15].d_val + lVar7 * 4);
      g_CrcTable[lVar7] = uVar1 >> 8 ^ g_CrcTable[uVar1 & 0xff];
    }
    g_CrcUpdate = CrcUpdateT4;
    lVar12 = 0;
    lVar7 = cpuid_basic_info(0);
    puVar2 = (uint *)cpuid_Version_info(1);
    uVar1 = *puVar2;
    uVar5 = uVar1 >> 8 & 0xf | uVar1 >> 0x10 & 0xff0;
    uVar8 = uVar1 >> 0xc & 0xf0;
    uVar3 = uVar1 >> 4 & 0xf;
    uVar4 = uVar3 | uVar8;
    pUVar9 = kVendors[0] + 2;
    for (; lVar12 != 3; lVar12 = lVar12 + 1) {
      if ((((*(UInt32 (*) [3])(pUVar9 + -2))[0] == *(UInt32 *)(lVar7 + 4)) &&
          (pUVar9[-1] == *(UInt32 *)(lVar7 + 8))) && (*pUVar9 == *(UInt32 *)(lVar7 + 0xc))) {
        iVar11 = (int)lVar12;
        if (iVar11 == 2) {
          if (uVar5 < 6) {
            return;
          }
          if (uVar5 == 6 && uVar4 < 0xf) {
            return;
          }
        }
        else if (iVar11 == 1) {
          if (uVar5 < 5) {
            return;
          }
          if (((uVar5 == 5) && (uVar4 < 0xb)) &&
             ((0x43fU >> (uVar3 | uVar1 >> 0xc & 0x10) & 1) != 0)) {
            return;
          }
        }
        else {
          if (iVar11 != 0) {
            return;
          }
          if (uVar5 < 6) {
            return;
          }
          if (uVar5 == 6) {
            if ((uVar1 >> 4 & 0xe | uVar8) == 0x26) {
              return;
            }
            if ((uVar4 < 0x37) && ((0x60000010000000U >> ((ulong)uVar4 & 0x3f) & 1) != 0)) {
              return;
            }
          }
        }
        g_CrcUpdate = CrcUpdateT8;
        return;
      }
      pUVar9 = pUVar9 + 3;
    }
  }
  return;
}

Assistant:

void SZIP_global_init(void)
{
    /* this just needs to calculate some things, so it only ever
       has to run once, even after a deinit. */
    static int generatedTable = 0;
    if (!generatedTable)
    {
        generatedTable = 1;
        CrcGenerateTable();
    } /* if */
}